

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::make_string(uint argc)

{
  int32_t iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  vm_val_t *this;
  uint in_EDI;
  vm_val_t ele_val_1;
  vm_val_t ele_val;
  utf8_ptr dst;
  size_t i;
  int lst_len;
  char *strp;
  char *new_strp;
  size_t new_str_len;
  CVmObjString *new_str;
  vm_obj_id_t new_str_obj;
  long rpt;
  vm_val_t val;
  vm_val_t *in_stack_ffffffffffffff58;
  utf8_ptr *in_stack_ffffffffffffff60;
  vm_val_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  vm_val_t *in_stack_ffffffffffffff80;
  int local_70;
  wchar_t local_68;
  utf8_ptr local_60;
  ulong local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  size_t local_38;
  CVmObject *local_30;
  vm_obj_id_t local_24;
  long local_20;
  vm_val_t local_18;
  uint local_4;
  
  local_48 = (char *)0x0;
  local_4c = -1;
  local_4 = in_EDI;
  utf8_ptr::utf8_ptr(&local_60);
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_ffffffffffffff60 >> 0x20),(uint)in_stack_ffffffffffffff60,
             (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  CVmStack::pop(&local_18);
  if (local_4 < 2) {
    iVar1 = 1;
  }
  else {
    iVar1 = CVmBif::pop_long_val();
  }
  local_20 = (long)iVar1;
  if (local_20 < 0) {
    err_throw(0);
  }
  CVmStack::push(&local_18);
  this = (vm_val_t *)(ulong)(local_18.typ - VM_OBJ);
  switch(this) {
  case (vm_val_t *)0x0:
    local_48 = vm_val_t::get_as_string(in_stack_ffffffffffffff58);
    if (local_48 == (char *)0x0) {
      iVar2 = vm_val_t::is_listlike(this);
      if ((iVar2 == 0) || (local_4c = vm_val_t::ll_length(in_stack_ffffffffffffff68), local_4c < 0))
      {
        err_throw(0);
      }
      goto LAB_002f9e6c;
    }
    break;
  default:
    err_throw(0);
  case (vm_val_t *)0x2:
    local_38 = utf8_ptr::s_wchar_size(local_18.val.intval);
    goto LAB_002f9f72;
  case (vm_val_t *)0x3:
    local_48 = CVmPoolInMem::get_ptr
                         ((CVmPoolInMem *)this,
                          (pool_ofs_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    break;
  case (vm_val_t *)0x5:
    local_4c = vm_val_t::ll_length(in_stack_ffffffffffffff68);
LAB_002f9e6c:
    local_38 = 0;
    for (local_58 = 1; (int)local_58 <= local_4c; local_58 = local_58 + 1) {
      vm_val_t::ll_index(in_stack_ffffffffffffff80,
                         (vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                         (int)((ulong)this >> 0x20));
      if (local_70 != 7) {
        err_throw(0);
      }
      sVar3 = utf8_ptr::s_wchar_size(local_68);
      local_38 = sVar3 + local_38;
    }
    goto LAB_002f9f72;
  }
  local_38 = vmb_get_len((char *)0x2f9efd);
LAB_002f9f72:
  if (0xfffd < local_38 * local_20) {
    err_throw(0);
  }
  local_38 = local_20 * local_38;
  local_24 = CVmObjString::create
                       ((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (size_t)in_stack_ffffffffffffff58);
  local_30 = vm_objp(0);
  local_40 = CVmObjString::cons_get_buf((CVmObjString *)local_30);
  utf8_ptr::set(&local_60,local_40);
  for (; local_20 != 0; local_20 = local_20 + -1) {
    if (local_4c < 0) {
      if (local_48 == (char *)0x0) {
        utf8_ptr::setch(in_stack_ffffffffffffff60,
                        (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      }
      else {
        in_stack_ffffffffffffff58 = (vm_val_t *)utf8_ptr::getptr(&local_60);
        in_stack_ffffffffffffff60 = (utf8_ptr *)(local_48 + 2);
        sVar3 = vmb_get_len((char *)0x2fa07c);
        memcpy(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,sVar3);
        pcVar4 = utf8_ptr::getptr(&local_60);
        sVar3 = vmb_get_len((char *)0x2fa0a6);
        utf8_ptr::set(&local_60,pcVar4 + sVar3);
      }
    }
    else {
      for (local_58 = 1; local_58 <= (ulong)(long)local_4c; local_58 = local_58 + 1) {
        vm_val_t::ll_index(in_stack_ffffffffffffff80,
                           (vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                           (int)((ulong)this >> 0x20));
        utf8_ptr::setch(in_stack_ffffffffffffff60,
                        (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      }
    }
  }
  CVmBif::retval_obj(0);
  CVmStack::discard();
  return;
}

Assistant:

void CVmBifTADS::make_string(VMG_ uint argc)
{
    vm_val_t val;
    long rpt;
    vm_obj_id_t new_str_obj;
    CVmObjString *new_str;
    size_t new_str_len;
    char *new_strp;
    const char *strp = 0;
    int lst_len = -1;
    size_t i;
    utf8_ptr dst;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the base value */
    G_stk->pop(&val);

    /* if there's a repeat count, get it */
    rpt = (argc >= 2 ? pop_long_val(vmg0_) : 1);

    /* if the repeat count is less than zero, it's an error */
    if (rpt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* leave the original value on the stack to protect it from GC */
    G_stk->push(&val);

    /* 
     *   see what we have, and calculate how much space we'll need for the
     *   result string 
     */
    switch(val.typ)
    {
    case VM_LIST:
        /* it's a list of integers giving unicode character values */
        lst_len = val.ll_length(vmg0_);

    do_list:
        /* 
         *   Run through the list and get the size of each character, so
         *   we can determine how long the string will have to be. 
         */
        for (new_str_len = 0, i = 1 ; (int)i <= lst_len ; ++i)
        {
            /* get this element */
            vm_val_t ele_val;
            val.ll_index(vmg_ &ele_val, i);

            /* if it's not an integer, it's an error */
            if (ele_val.typ != VM_INT)
                err_throw(VMERR_INT_VAL_REQD);

            /* add this character's byte size to the string size */
            new_str_len +=
                utf8_ptr::s_wchar_size((wchar_t)ele_val.val.intval);
        }
        break;

    case VM_SSTRING:
        /* get the string pointer */
        strp = G_const_pool->get_ptr(val.val.ofs);
        
    do_string:
        /* 
         *   it's a string - the output length is the same as the input
         *   length 
         */
        new_str_len = vmb_get_len(strp);
        break;

    case VM_INT:
        /* 
         *   it's an integer giving a unicode character value - we just
         *   need enough space to store this particular character 
         */
        new_str_len = utf8_ptr::s_wchar_size((wchar_t)val.val.intval);
        break;

    case VM_OBJ:
        /* check to see if it's a string */
        if ((strp = val.get_as_string(vmg0_)) != 0)
            goto do_string;

        /* check to see if it's a list */
        if (val.is_listlike(vmg0_) && (lst_len = val.ll_length(vmg0_)) >= 0)
            goto do_list;

        /* it's invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;

    default:
        /* other types are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;
    }

    /* 
     *   if the length times the repeat count would be over the maximum
     *   16-bit string length, it's an error 
     */
    if (new_str_len * rpt > 0xffffL - VMB_LEN)
        err_throw(VMERR_BAD_VAL_BIF);

    /* multiply the length by the repeat count */
    new_str_len *= rpt;
    
    /* allocate the string and gets its buffer */
    new_str_obj = CVmObjString::create(vmg_ FALSE, new_str_len);
    new_str = (CVmObjString *)vm_objp(vmg_ new_str_obj);
    new_strp = new_str->cons_get_buf();
    
    /* set up the destination pointer */
    dst.set(new_strp);

    /* run through the number of iterations requested */
    for ( ; rpt != 0 ; --rpt)
    {
        /* build one iteration of the string, according to the type */
        if (lst_len >= 0)
        {
            /* run through the list */
            for (i = 1 ; i <= (size_t)lst_len ; ++i)
            {
                /* get this element */
                vm_val_t ele_val;
                val.ll_index(vmg_ &ele_val, i);

                /* add this character to the string */
                dst.setch((wchar_t)ele_val.val.intval);
            }
        }
        else if (strp != 0)
        {
            /* copy the string's contents into the output string */
            memcpy(dst.getptr(), strp + VMB_LEN, vmb_get_len(strp));

            /* advance past the bytes we copied */
            dst.set(dst.getptr() + vmb_get_len(strp));
        }
        else
        {
            /* set this int value */
            dst.setch((wchar_t)val.val.intval);
        }
    }

    /* return the new string */
    retval_obj(vmg_ new_str_obj);

    /* discard the GC protection */
    G_stk->discard();
}